

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall
capnp::List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Builder::set
          (Builder *this,uint index,initializer_list<capnp::Text::Reader> value)

{
  uint uVar1;
  const_iterator pRVar2;
  Reader *element;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<capnp::Text::Reader> *__range3;
  undefined1 local_50 [4];
  uint i;
  Builder l;
  uint index_local;
  Builder *this_local;
  initializer_list<capnp::Text::Reader> value_local;
  
  value_local._M_array = (iterator)value._M_len;
  this_local = (Builder *)value._M_array;
  l.builder._36_4_ = index;
  uVar1 = size(this);
  if (index < uVar1) {
    std::initializer_list<capnp::Text::Reader>::size
              ((initializer_list<capnp::Text::Reader> *)&this_local);
    init((Builder *)local_50,(EVP_PKEY_CTX *)this);
    __range3._4_4_ = 0;
    __end0 = std::initializer_list<capnp::Text::Reader>::begin
                       ((initializer_list<capnp::Text::Reader> *)&this_local);
    pRVar2 = std::initializer_list<capnp::Text::Reader>::end
                       ((initializer_list<capnp::Text::Reader> *)&this_local);
    for (; __end0 != pRVar2; __end0 = __end0 + 1) {
      List<capnp::Text,_(capnp::Kind)1>::Builder::set
                ((Builder *)local_50,__range3._4_4_,(Reader)(__end0->super_StringPtr).content);
      __range3._4_4_ = __range3._4_4_ + 1;
    }
    return;
  }
  kj::_::inlineRequireFailure
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/../capnp/list.h"
             ,0x18b,"index < size()","",(char *)0x0);
}

Assistant:

void set(uint index, std::initializer_list<ReaderFor<T>> value) {
      KJ_IREQUIRE(index < size());
      auto l = init(index, value.size());
      uint i = 0;
      for (auto& element: value) {
        l.set(i++, element);
      }
    }